

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

vector<hta::Row,_std::allocator<hta::Row>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,Metric *this,
          TimePoint begin,TimePoint end,uint64_t min_samples,IntervalScope scope)

{
  check_read(this);
  if ((long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r <=
      (long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r) {
    retrieve(__return_storage_ptr__,this,begin,end,
             (Duration)
             ((ulong)((long)end.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r -
                     (long)begin.
                           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           .__d.__r) / min_samples),scope);
    return __return_storage_ptr__;
  }
  throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
            ("Metric::retrieve(min_samples) invalid request: begin timestamp ",
             (time_point)
             begin.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r," larger than end timestamp ",
             (time_point)
             end.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r);
}

Assistant:

std::vector<Row> Metric::retrieve(TimePoint begin, TimePoint end, uint64_t min_samples,
                                  IntervalScope scope)
{
    check_read();
    if (begin > end)
    {
        throw_exception("Metric::retrieve(min_samples) invalid request: begin timestamp ", begin,
                        " larger than end timestamp ", end);
    }
    auto duration = end - begin;
    auto interval_max_length = duration / min_samples;
    return retrieve(begin, end, interval_max_length, scope);
}